

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaObjectBuilder::QMetaObjectBuilder(QMetaObjectBuilder *this)

{
  QMetaObjectBuilderPrivate *this_00;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QMetaObjectBuilder_00be4b70;
  this_00 = (QMetaObjectBuilderPrivate *)operator_new(0xd8);
  QMetaObjectBuilderPrivate::QMetaObjectBuilderPrivate(this_00);
  in_RDI[1] = this_00;
  return;
}

Assistant:

QMetaObjectBuilder::QMetaObjectBuilder()
{
    d = new QMetaObjectBuilderPrivate();
}